

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O0

size_t __thiscall rtosc::Port::MetaContainer::length(MetaContainer *this)

{
  bool bVar1;
  char *itr;
  char prev;
  MetaContainer *this_local;
  char *local_8;
  
  if ((this->str_ptr == (char *)0x0) || (*this->str_ptr == '\0')) {
    local_8 = (char *)0x0;
  }
  else {
    prev = '\0';
    itr = this->str_ptr;
    while( true ) {
      bVar1 = true;
      if (prev == '\0') {
        bVar1 = *itr != '\0';
      }
      if (!bVar1) break;
      prev = *itr;
      itr = itr + 1;
    }
    local_8 = itr + (2 - (long)this->str_ptr);
  }
  return (size_t)local_8;
}

Assistant:

size_t Port::MetaContainer::length(void) const
{
        if(!str_ptr || !*str_ptr)
            return 0;
        char prev = 0;
        const char *itr = str_ptr;
        while(prev || *itr)
            prev = *itr++;
        return 2+(itr-str_ptr);
}